

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::php::anon_unknown_0::PhpGeneratorTest_ClosedEnumError_Test::TestBody
          (PhpGeneratorTest_ClosedEnumError_Test *this)

{
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  PhpGeneratorTest_ClosedEnumError_Test *local_10;
  PhpGeneratorTest_ClosedEnumError_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"\n    syntax = \"proto2\";\n    enum Foo {\n      BAR = 0;\n    }");
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_40,"protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");
  CommandLineInterfaceTester::RunProtoc((CommandLineInterfaceTester *)this,local_40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,"Can\'t generate PHP code for closed enum Foo");
  CommandLineInterfaceTester::ExpectErrorSubstring((CommandLineInterfaceTester *)this,local_50);
  return;
}

Assistant:

TEST_F(PhpGeneratorTest, ClosedEnumError) {
  CreateTempFile("foo.proto",
                 R"schema(
    syntax = "proto2";
    enum Foo {
      BAR = 0;
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --php_out=$tmpdir foo.proto");

  ExpectErrorSubstring("Can't generate PHP code for closed enum Foo");
}